

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

void lua_arith(lua_State *L,int op)

{
  StkId pTVar1;
  StkId pTVar2;
  TValue *rc;
  lua_Number lVar3;
  TValue *io;
  TValue *io1;
  TValue *io2;
  StkId o2;
  StkId o1;
  int op_local;
  lua_State *L_local;
  
  if (op == 6) {
    pTVar1 = L->top;
    pTVar2 = L->top;
    pTVar2->value_ = pTVar1[-1].value_;
    pTVar2->tt_ = pTVar1[-1].tt_;
    L->top = L->top + 1;
  }
  pTVar1 = L->top;
  pTVar2 = pTVar1 + -2;
  rc = L->top + -1;
  if ((pTVar1[-2].tt_ == 3) && (L->top[-1].tt_ == 3)) {
    lVar3 = luaO_arith(op,(pTVar2->value_).n,(rc->value_).n);
    (pTVar2->value_).n = lVar3;
    pTVar1[-2].tt_ = 3;
  }
  else {
    luaV_arith(L,pTVar2,pTVar2,rc,op + TM_ADD);
  }
  L->top = L->top + -1;
  return;
}

Assistant:

LUA_API void lua_arith (lua_State *L, int op) {
  StkId o1;  /* 1st operand */
  StkId o2;  /* 2nd operand */
  lua_lock(L);
  if (op != LUA_OPUNM) /* all other operations expect two operands */
    api_checknelems(L, 2);
  else {  /* for unary minus, add fake 2nd operand */
    api_checknelems(L, 1);
    setobjs2s(L, L->top, L->top - 1);
    L->top++;
  }
  o1 = L->top - 2;
  o2 = L->top - 1;
  if (ttisnumber(o1) && ttisnumber(o2)) {
    setnvalue(o1, luaO_arith(op, nvalue(o1), nvalue(o2)));
  }
  else
    luaV_arith(L, o1, o1, o2, cast(TMS, op - LUA_OPADD + TM_ADD));
  L->top--;
  lua_unlock(L);
}